

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O3

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::DeleteAll
          (ParallelStringRadixSort<const_unsigned_char_*> *this)

{
  if (this->temp_ != (uchar **)0x0) {
    operator_delete__(this->temp_);
  }
  if (this->letters8_ != (uint8_t *)0x0) {
    operator_delete__(this->letters8_);
  }
  if (this->letters16_ != (uint16_t *)0x0) {
    operator_delete__(this->letters16_);
  }
  this->max_elems_ = 0;
  this->letters16_ = (uint16_t *)0x0;
  this->temp_ = (uchar **)0x0;
  this->letters8_ = (uint8_t *)0x0;
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>::DeleteAll() {
  delete [] temp_;
  delete [] letters8_;
  delete [] letters16_;
  max_elems_ = 0;
  temp_ = NULL;
  letters8_ = NULL;
  letters16_ = NULL;
}